

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avsd_api.c
# Opt level: O1

MPP_RET avsd_init(void *decoder,ParserCfg *init)

{
  undefined8 *puVar1;
  MppBufSlots pvVar2;
  long lVar3;
  MppBufSlots pvVar4;
  MppDecCfgSet *pMVar5;
  void *pvVar6;
  long lVar7;
  long lVar8;
  MPP_RET MVar9;
  undefined8 uVar10;
  
  if (((byte)avsd_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avsd_api","In.","avsd_init");
  }
  if (decoder == (void *)0x0) {
    if (((byte)avsd_parse_debug & 4) != 0) {
      _mpp_log_l(4,"avsd_api","input empty(%d).\n",(char *)0x0,0x4a);
    }
LAB_0017e909:
    MVar9 = MPP_OK;
    if (((byte)avsd_parse_debug & 8) != 0) {
      MVar9 = MPP_OK;
      _mpp_log_l(4,"avsd_api","Out.","avsd_init");
    }
  }
  else {
    memset(decoder,0,400);
    mpp_env_get_u32("avsd_debug",&avsd_parse_debug,0);
    pvVar2 = init->frame_slots;
    pvVar4 = init->packet_slots;
    pMVar5 = init->cfg;
    *(undefined8 *)((long)decoder + 0x20) = *(undefined8 *)init;
    *(MppBufSlots *)((long)decoder + 0x28) = pvVar2;
    *(MppBufSlots *)((long)decoder + 0x30) = pvVar4;
    *(MppDecCfgSet **)((long)decoder + 0x38) = pMVar5;
    *(MppDecHwCap **)((long)decoder + 0x40) = init->hw_info;
    pvVar2 = init->frame_slots;
    *(MppBufSlots *)decoder = pvVar2;
    *(MppBufSlots *)((long)decoder + 8) = init->packet_slots;
    mpp_buf_slot_setup(pvVar2,0xc);
    pvVar6 = mpp_osal_calloc("avsd_init",0x228);
    *(void **)((long)decoder + 0x50) = pvVar6;
    if (pvVar6 == (void *)0x0) {
      uVar10 = 0x55;
    }
    else {
      *(void **)((long)decoder + 0x140) = pvVar6;
      *(undefined4 *)((long)decoder + 100) = 0x200000;
      pvVar6 = mpp_osal_malloc("avsd_init",0x200000);
      *(void **)((long)decoder + 0x58) = pvVar6;
      if (pvVar6 == (void *)0x0) {
        uVar10 = 0x5a;
      }
      else {
        mpp_packet_init((MppPacket *)((long)decoder + 0x10),pvVar6,
                        (ulong)*(uint *)((long)decoder + 100));
        mpp_packet_set_length(*(MppPacket *)((long)decoder + 0x10),0);
        if (*(long *)((long)decoder + 0x10) != 0) {
          lVar7 = 0x110;
          lVar8 = 0;
          do {
            lVar3 = *(long *)((long)decoder + 0x50);
            *(undefined8 *)(lVar3 + lVar7) = 0;
            ((undefined8 *)(lVar3 + lVar7))[1] = 0;
            puVar1 = (undefined8 *)(lVar3 + 0x30 + lVar7);
            *puVar1 = 0;
            puVar1[1] = 0;
            puVar1 = (undefined8 *)(lVar3 + 0x20 + lVar7);
            *puVar1 = 0;
            puVar1[1] = 0;
            puVar1 = (undefined8 *)(lVar3 + 0x10 + lVar7);
            *puVar1 = 0;
            puVar1[1] = 0;
            *(int *)(lVar3 + 4 + lVar7) = (int)lVar8;
            *(undefined4 *)(lVar3 + 0x3c + lVar7) = 0xffffffff;
            lVar8 = lVar8 + 1;
            lVar7 = lVar7 + 0x40;
          } while (lVar8 != 3);
          *(long *)((long)decoder + 0x68) = *(long *)((long)decoder + 0x50) + 0x1d0;
          *(undefined4 *)((long)decoder + 0x160) = 1;
          goto LAB_0017e909;
        }
        uVar10 = 0x5e;
      }
    }
    _mpp_log_l(2,"avsd_api","malloc buffer error(%d).\n","avsd_init",uVar10);
    avsd_deinit(decoder);
    MVar9 = MPP_ERR_MALLOC;
  }
  return MVar9;
}

Assistant:

static MPP_RET avsd_init(void *decoder, ParserCfg *init)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    RK_S32 i = 0;
    AvsdCtx_t *p_dec = (AvsdCtx_t *)decoder;

    AVSD_PARSE_TRACE("In.");
    INP_CHECK(ret, !p_dec);

    memset(p_dec, 0, sizeof(AvsdCtx_t));
    mpp_env_get_u32("avsd_debug", &avsd_parse_debug, 0);
    //!< restore init parameters
    p_dec->init = *init;
    p_dec->frame_slots = init->frame_slots;
    p_dec->packet_slots = init->packet_slots;
    //!< decoder parameters
    mpp_buf_slot_setup(p_dec->frame_slots, 12);
    p_dec->mem = mpp_calloc(AvsdMemory_t, 1);
    MEM_CHECK(ret, p_dec->mem);

    p_dec->syn = &p_dec->mem->syntax;
    p_dec->stream_size = MAX_STREAM_SIZE;
    p_dec->streambuf = mpp_malloc(RK_U8, p_dec->stream_size);
    MEM_CHECK(ret, p_dec->streambuf);
    mpp_packet_init(&p_dec->task_pkt, p_dec->streambuf, p_dec->stream_size);

    mpp_packet_set_length(p_dec->task_pkt, 0);
    MEM_CHECK(ret, p_dec->task_pkt);
    for (i = 0; i < 3; i++) {
        AvsdFrame_t *frm = &p_dec->mem->save[i];

        memset(frm, 0, sizeof(*frm));
        frm->idx = i;
        frm->slot_idx = -1;
    }
    p_dec->bx = &p_dec->mem->bitctx;
    p_dec->need_split = 1;

__RETURN:
    AVSD_PARSE_TRACE("Out.");
    return ret = MPP_OK;
__FAILED:
    avsd_deinit(decoder);

    return ret;
}